

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  undefined2 uVar1;
  int a_00;
  long lVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  stbi__uint32 sVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  stbi_uc *__dest;
  byte bVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  stbi_uc *psVar30;
  byte *pbVar31;
  bool bVar32;
  byte *local_108;
  long local_f8;
  uint local_e8;
  ulong local_88;
  ulong uVar22;
  
  bVar32 = depth == 0x10;
  a_00 = a->s->img_n;
  lVar29 = (long)a_00;
  psVar9 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar32,0);
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar4 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar5 = a_00 * x;
      uVar21 = uVar5 * depth + 7 >> 3;
      uVar22 = (ulong)uVar21;
      if (raw_len < (uVar21 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else {
        lVar26 = (long)(out_n << bVar32);
        uVar6 = x * out_n;
        uVar18 = uVar6 << bVar32;
        uVar28 = (ulong)uVar18;
        uVar8 = 0;
        uVar21 = uVar6 - uVar21;
        if (7 < depth) {
          uVar21 = 0;
        }
        uVar23 = (ulong)uVar21;
        lVar24 = uVar23 - uVar28;
        uVar17 = 0;
        lVar19 = -lVar26;
        local_88 = (ulong)x;
        local_108 = raw;
        local_e8 = a_00 << bVar32;
        while( true ) {
          if (uVar17 == y) {
            if (depth < 8) {
              uVar21 = 0;
              for (uVar28 = 0; uVar28 != y; uVar28 = uVar28 + 1) {
                bVar3 = 1;
                if (color == 0) {
                  bVar3 = ""[depth];
                }
                uVar17 = (ulong)(uVar18 * (int)uVar28);
                uVar23 = (ulong)uVar21;
                psVar9 = a->out;
                if (depth == 4) {
                  lVar29 = (uVar6 - uVar22) + uVar23;
                  lVar26 = 0;
                  for (uVar8 = uVar5; 1 < (int)uVar8; uVar8 = uVar8 - 2) {
                    psVar9[lVar26 * 2 + uVar23] = (psVar9[lVar26 + lVar29] >> 4) * bVar3;
                    psVar9[lVar26 * 2 + uVar23 + 1] = (psVar9[lVar26 + lVar29] & 0xf) * bVar3;
                    lVar26 = lVar26 + 1;
                  }
                  if (uVar8 == 1) {
                    psVar9[lVar26 * 2 + uVar23] = (psVar9[lVar26 + lVar29] >> 4) * bVar3;
                  }
                }
                else {
                  pbVar31 = psVar9 + ((uVar17 + uVar6) - uVar22);
                  if (depth == 2) {
                    psVar9 = psVar9 + uVar23 + 3;
                    for (uVar8 = uVar5; 3 < (int)uVar8; uVar8 = uVar8 - 4) {
                      psVar9[-3] = (*pbVar31 >> 6) * bVar3;
                      psVar9[-2] = (*pbVar31 >> 4 & 3) * bVar3;
                      psVar9[-1] = (*pbVar31 >> 2 & 3) * bVar3;
                      bVar16 = *pbVar31;
                      pbVar31 = pbVar31 + 1;
                      *psVar9 = (bVar16 & 3) * bVar3;
                      psVar9 = psVar9 + 4;
                    }
                    if (((0 < (int)uVar8) && (psVar9[-3] = (*pbVar31 >> 6) * bVar3, uVar8 != 1)) &&
                       (psVar9[-2] = (*pbVar31 >> 4 & 3) * bVar3, uVar8 == 3)) {
                      psVar9[-1] = (*pbVar31 >> 2 & 3) * bVar3;
                    }
                  }
                  else if (depth == 1) {
                    pbVar10 = psVar9 + uVar23 + 7;
                    for (uVar8 = uVar5; 7 < (int)uVar8; uVar8 = uVar8 - 8) {
                      pbVar10[-7] = (char)*pbVar31 >> 7 & bVar3;
                      pbVar10[-6] = (char)(*pbVar31 * '\x02') >> 7 & bVar3;
                      pbVar10[-5] = (char)(*pbVar31 << 2) >> 7 & bVar3;
                      pbVar10[-4] = (char)(*pbVar31 << 3) >> 7 & bVar3;
                      pbVar10[-3] = (char)(*pbVar31 << 4) >> 7 & bVar3;
                      pbVar10[-2] = (char)(*pbVar31 << 5) >> 7 & bVar3;
                      pbVar10[-1] = (char)(*pbVar31 << 6) >> 7 & bVar3;
                      bVar16 = bVar3;
                      if ((*pbVar31 & 1) == 0) {
                        bVar16 = 0;
                      }
                      pbVar31 = pbVar31 + 1;
                      *pbVar10 = bVar16;
                      pbVar10 = pbVar10 + 8;
                    }
                    if (((((0 < (int)uVar8) &&
                          (pbVar10[-7] = (char)*pbVar31 >> 7 & bVar3, uVar8 != 1)) &&
                         ((pbVar10[-6] = (char)(*pbVar31 * '\x02') >> 7 & bVar3, 2 < uVar8 &&
                          ((pbVar10[-5] = (char)(*pbVar31 << 2) >> 7 & bVar3, uVar8 != 3 &&
                           (pbVar10[-4] = (char)(*pbVar31 << 3) >> 7 & bVar3, 4 < uVar8)))))) &&
                        (pbVar10[-3] = (char)(*pbVar31 << 4) >> 7 & bVar3, uVar8 != 5)) &&
                       (pbVar10[-2] = (char)(*pbVar31 << 5) >> 7 & bVar3, uVar8 == 7)) {
                      pbVar10[-1] = (char)(*pbVar31 << 6) >> 7 & bVar3;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar9 = a->out;
                  iVar4 = x - 1;
                  uVar8 = x * 4;
                  uVar15 = x * 3;
                  if (a_00 == 1) {
                    uVar8 = x * 2 - 1;
                    for (iVar4 = 0; -1 < (int)((x - 1) + iVar4); iVar4 = iVar4 + -1) {
                      psVar9[uVar8 + uVar17] = 0xff;
                      uVar15 = uVar8 - 1;
                      uVar8 = uVar8 - 2;
                      psVar9[uVar15 + uVar17] = psVar9[((x - 1) + iVar4 & 0x7fffffff) + uVar17];
                    }
                  }
                  else {
                    while( true ) {
                      uVar15 = uVar15 - 3;
                      if (iVar4 < 0) break;
                      iVar4 = iVar4 + -1;
                      psVar9[(uVar8 - 1) + uVar17] = 0xff;
                      psVar9[(uVar8 - 2) + uVar17] = psVar9[(ulong)uVar15 + uVar17 + 2];
                      psVar9[(uVar8 - 3) + uVar17] = psVar9[(ulong)uVar15 + uVar17 + 1];
                      psVar9[(uVar8 - 4) + uVar17] = psVar9[uVar15 + uVar17];
                      uVar8 = uVar8 - 4;
                    }
                  }
                }
                uVar21 = uVar21 + uVar18;
              }
            }
            else if (depth == 0x10) {
              psVar9 = a->out;
              for (lVar29 = 0; uVar6 * y != (int)lVar29; lVar29 = lVar29 + 1) {
                uVar1 = swap_bytes(*(undefined2 *)(psVar9 + lVar29 * 2));
                *(undefined2 *)(psVar9 + lVar29 * 2) = uVar1;
              }
            }
            return 1;
          }
          uVar14 = (ulong)*local_108;
          if (4 < uVar14) break;
          uVar21 = local_e8;
          if (depth < 8) {
            uVar21 = 1;
            local_88 = uVar22;
          }
          if (uVar17 == 0) {
            uVar14 = (ulong)""[uVar14];
          }
          uVar20 = (ulong)uVar8;
          uVar15 = uVar18 * (int)uVar17;
          uVar25 = (ulong)(~((int)uVar21 >> 0x1f) & uVar21);
          psVar9 = a->out;
          lVar12 = -uVar28 + uVar20 + uVar23;
          for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
            switch(uVar14) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar3 = local_108[uVar27 + 1];
              break;
            case 2:
              bVar3 = psVar9[uVar27 + lVar12];
              goto LAB_002b81b0;
            case 3:
              bVar3 = psVar9[uVar27 + lVar12] >> 1;
LAB_002b81b0:
              bVar3 = bVar3 + local_108[uVar27 + 1];
              break;
            case 4:
              bVar3 = local_108[uVar27 + 1];
              iVar4 = stbi__paeth(0,(uint)psVar9[uVar27 + lVar12],0);
              bVar3 = (char)iVar4 + bVar3;
              break;
            default:
              goto switchD_002b8167_default;
            }
            psVar9[uVar27 + uVar20 + uVar23] = bVar3;
switchD_002b8167_default:
          }
          lVar12 = (long)(int)local_e8;
          if (depth == 8) {
            lVar13 = (long)out_n;
            lVar2 = lVar29;
            if (a_00 != out_n) {
              psVar9[lVar29 + (ulong)uVar15] = 0xff;
            }
LAB_002b8216:
            local_108 = local_108 + lVar2 + 1;
            lVar2 = lVar13 + (ulong)uVar15;
          }
          else {
            if (depth == 0x10) {
              lVar13 = lVar26;
              lVar2 = lVar12;
              if (a_00 != out_n) {
                (psVar9 + lVar12 + (ulong)uVar15)[0] = 0xff;
                (psVar9 + lVar12 + (ulong)uVar15)[1] = 0xff;
              }
              goto LAB_002b8216;
            }
            local_108 = local_108 + 2;
            lVar2 = uVar23 + uVar15 + 1;
            lVar13 = 1;
          }
          __dest = psVar9 + lVar2;
          if (a_00 == out_n || depth < 8) {
            uVar15 = ((int)local_88 + -1) * uVar21;
            if ((byte)uVar14 < 7) {
              lVar12 = (long)(int)uVar21;
              uVar7 = (int)uVar15 >> 0x1f;
              switch(uVar14) {
              case 0:
                memcpy(__dest,local_108,(long)(int)uVar15);
                break;
              case 1:
                for (uVar14 = 0; (~uVar7 & uVar15) != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = __dest[uVar14 - lVar12] + local_108[uVar14];
                }
                break;
              case 2:
                for (uVar14 = 0; (~uVar7 & uVar15) != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = psVar9[uVar14 + lVar13 + uVar20 + lVar24] + local_108[uVar14];
                }
                break;
              case 3:
                for (uVar14 = 0; (~uVar7 & uVar15) != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] =
                       (char)((uint)__dest[uVar14 - lVar12] +
                              (uint)psVar9[uVar14 + lVar13 + uVar20 + lVar24] >> 1) +
                       local_108[uVar14];
                }
                break;
              case 4:
                uVar14 = (ulong)(~uVar7 & uVar15);
                pbVar10 = psVar9 + lVar13 + uVar20 + lVar24;
                pbVar31 = local_108;
                while (bVar32 = uVar14 != 0, uVar14 = uVar14 - 1, bVar32) {
                  bVar3 = *pbVar31;
                  iVar4 = stbi__paeth((uint)__dest[-lVar12],(uint)*pbVar10,(uint)pbVar10[-lVar12]);
                  pbVar10 = pbVar10 + 1;
                  pbVar31 = pbVar31 + 1;
                  *__dest = (char)iVar4 + bVar3;
                  __dest = __dest + 1;
                }
                break;
              case 5:
                for (uVar14 = 0; (~uVar7 & uVar15) != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = (__dest[uVar14 - lVar12] >> 1) + local_108[uVar14];
                }
                break;
              case 6:
                for (uVar14 = 0; (~uVar7 & uVar15) != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = __dest[uVar14 - lVar12] + local_108[uVar14];
                }
              }
            }
            local_108 = local_108 + (int)uVar15;
          }
          else {
            if ((byte)uVar14 < 7) {
              psVar30 = psVar9 + lVar13 + -uVar28 + uVar23 + uVar15;
              switch(uVar14) {
              case 0:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = local_108[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  __dest = __dest + lVar26;
                }
                break;
              case 1:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = __dest[uVar14 + lVar19] + local_108[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  __dest = __dest + lVar26;
                }
                break;
              case 2:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = psVar30[uVar14] + local_108[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  __dest = __dest + lVar26;
                  psVar30 = psVar30 + lVar26;
                }
                break;
              case 3:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] =
                         (char)((uint)__dest[uVar14 + lVar19] + (uint)psVar30[uVar14] >> 1) +
                         local_108[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  __dest = __dest + lVar26;
                  psVar30 = psVar30 + lVar26;
                }
                break;
              case 4:
                local_f8 = (long)__dest + lVar19;
                psVar9 = psVar9 + lVar13 + uVar20 + ((uVar23 - lVar26) - uVar28);
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    bVar3 = local_108[uVar14];
                    iVar4 = stbi__paeth((uint)*(byte *)(local_f8 + uVar14),(uint)psVar30[uVar14],
                                        (uint)psVar9[uVar14]);
                    __dest[uVar14] = (char)iVar4 + bVar3;
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  local_f8 = local_f8 + lVar26;
                  __dest = __dest + lVar26;
                  psVar30 = psVar30 + lVar26;
                  psVar9 = psVar9 + lVar26;
                }
                break;
              case 5:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = (__dest[uVar14 + lVar19] >> 1) + local_108[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  __dest = __dest + lVar26;
                }
                break;
              case 6:
                sVar11 = x;
                while (sVar11 = sVar11 - 1, sVar11 != 0) {
                  for (uVar14 = 0; uVar25 != uVar14; uVar14 = uVar14 + 1) {
                    __dest[uVar14] = __dest[uVar14 + lVar19] + local_108[uVar14];
                  }
                  __dest[lVar12] = 0xff;
                  local_108 = local_108 + lVar12;
                  __dest = __dest + lVar26;
                }
              }
            }
            if (depth == 0x10) {
              psVar9 = a->out + (long)(int)(local_e8 + 1) + uVar20;
              sVar11 = x;
              while (bVar32 = sVar11 != 0, sVar11 = sVar11 - 1, bVar32) {
                *psVar9 = 0xff;
                psVar9 = psVar9 + lVar26;
              }
            }
          }
          uVar17 = uVar17 + 1;
          uVar8 = uVar18 + uVar8;
          local_e8 = uVar21;
        }
        stbi__g_failure_reason = "invalid filter";
      }
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }